

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O3

void anm_free(anm_archive_t *anm)

{
  uchar *puVar1;
  long *__ptr;
  void *pvVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  list_node_t *plVar5;
  
  puVar1 = anm->map;
  for (plVar5 = (anm->names).head; plVar5 != (list_node_t *)0x0; plVar5 = plVar5->next) {
    free(plVar5->data);
  }
  list_free_nodes(&anm->names);
  for (plVar5 = (anm->entries).head; plVar5 != (list_node_t *)0x0; plVar5 = plVar5->next) {
    __ptr = (long *)plVar5->data;
    for (puVar4 = (undefined8 *)__ptr[9]; puVar4 != (undefined8 *)0x0;
        puVar4 = (undefined8 *)*puVar4) {
      pvVar2 = (void *)puVar4[2];
      if (puVar1 == (uchar *)0x0) {
        free(*(void **)((long)pvVar2 + 8));
      }
      for (puVar3 = *(undefined8 **)((long)pvVar2 + 0x10); puVar3 != (undefined8 *)0x0;
          puVar3 = (undefined8 *)*puVar3) {
        thanm_instr_free((thanm_instr_t *)puVar3[2]);
      }
      if ((puVar1 == (uchar *)0x0) || (*(int *)(*__ptr + 0x28) == 0)) {
        for (puVar3 = *(undefined8 **)((long)pvVar2 + 0x20); puVar3 != (undefined8 *)0x0;
            puVar3 = (undefined8 *)*puVar3) {
          free((void *)puVar3[2]);
        }
      }
      list_free_nodes((list_t *)((long)pvVar2 + 0x10));
      list_free_nodes((list_t *)((long)pvVar2 + 0x20));
      free(pvVar2);
    }
    list_free_nodes((list_t *)(__ptr + 9));
    pvVar2 = (void *)*__ptr;
    if (puVar1 == (uchar *)0x0) {
      free(pvVar2);
      free((void *)__ptr[1]);
      free((void *)__ptr[3]);
      free((void *)__ptr[0xb]);
      for (puVar4 = (undefined8 *)__ptr[7]; puVar4 != (undefined8 *)0x0;
          puVar4 = (undefined8 *)*puVar4) {
        free((void *)puVar4[2]);
      }
    }
    else if (6 < *(uint *)((long)pvVar2 + 0x28)) {
      free(pvVar2);
    }
    list_free_nodes((list_t *)(__ptr + 7));
    free((void *)__ptr[4]);
    free(__ptr);
  }
  list_free_nodes(&anm->entries);
  if (puVar1 != (uchar *)0x0) {
    file_munmap(anm->map,anm->map_size);
  }
  free(anm);
  return;
}

Assistant:

static void
anm_free(
    anm_archive_t* anm)
{
    int is_mapped = anm->map != NULL;

    char* name;
    list_for_each(&anm->names, name)
        free(name);
    list_free_nodes(&anm->names);

    anm_entry_t* entry;
    list_for_each(&anm->entries, entry) {
        anm_script_t* script;
        list_for_each(&entry->scripts, script) {
            if (!is_mapped)
                free(script->offset);

            thanm_instr_t* instr;
            list_for_each(&script->instrs, instr) {
                thanm_instr_free(instr);
            }
            if (!is_mapped || entry->header->version == 0) {
                anm_instr_t* instr;
                list_for_each(&script->raw_instrs, instr) {
                    free(instr);
                }
            }
            list_free_nodes(&script->instrs);
            list_free_nodes(&script->raw_instrs);

            free(script);
        }
        list_free_nodes(&entry->scripts);

        if (!is_mapped) {
            free(entry->header);
            free(entry->thtx);
            free(entry->name2);
            free(entry->data);

            sprite19_t* sprite;
            list_for_each(&entry->sprites, sprite)
                free(sprite);
        } else if (entry->header->version >= 7) {
            free(entry->header);
        }
        list_free_nodes(&entry->sprites);

        free(entry->filename);
        free(entry);
    }
    list_free_nodes(&anm->entries);

    if (is_mapped)
        file_munmap(anm->map, anm->map_size);

    free(anm);
}